

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.hpp
# Opt level: O0

string * __thiscall cinatra::uri_t::get_path_abi_cxx11_(uri_t *this)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  string *in_RDI;
  allocator<char> local_25 [5];
  allocator<char> *in_stack_ffffffffffffffe0;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffe8;
  
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)(in_RSI + 2));
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_RSI,(char *)in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffef);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              (in_RSI,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
    std::allocator<char>::~allocator(local_25);
  }
  return in_RDI;
}

Assistant:

std::string get_path() const {
    if (path.empty())
      return "/";

    return std::string(path);
  }